

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_states.cpp
# Opt level: O3

void __thiscall duckdb::WindowAggregateStates::Initialize(WindowAggregateStates *this,idx_t count)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr;
  data_ptr_t pdVar1;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_01;
  type pVVar2;
  pointer this_02;
  idx_t iVar3;
  pointer puVar4;
  LogicalType LStack_48;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             this->state_size * count);
  puVar4 = (this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01._M_head_impl = (Vector *)operator_new(0x68);
  LogicalType::LogicalType(&LStack_48,POINTER);
  Vector::Vector(this_01._M_head_impl,&LStack_48,count);
  LogicalType::~LogicalType(&LStack_48);
  this_00 = &this->statef;
  __ptr._M_head_impl =
       (this->statef).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
  (this->statef).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = this_01._M_head_impl;
  if (__ptr._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)this_00,__ptr._M_head_impl);
  }
  pVVar2 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00)
  ;
  if (count != 0) {
    pdVar1 = pVVar2->data;
    iVar3 = 0;
    do {
      *(pointer *)(pdVar1 + iVar3 * 8) = puVar4;
      (*(this->aggr).function.initialize)((AggregateFunction *)this,puVar4);
      iVar3 = iVar3 + 1;
      puVar4 = puVar4 + this->state_size;
    } while (count != iVar3);
  }
  this_02 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                      (this_00);
  Vector::SetVectorType(this_02,FLAT_VECTOR);
  return;
}

Assistant:

void WindowAggregateStates::Initialize(idx_t count) {
	// Don't leak - every Initialize must be matched with a Destroy
	D_ASSERT(states.empty());

	states.resize(count * state_size);
	auto state_ptr = states.data();

	statef = make_uniq<Vector>(LogicalType::POINTER, count);
	auto state_f_data = FlatVector::GetData<data_ptr_t>(*statef);

	for (idx_t i = 0; i < count; ++i, state_ptr += state_size) {
		state_f_data[i] = state_ptr;
		aggr.function.initialize(aggr.function, state_ptr);
	}

	// Prevent conversion of results to constants
	statef->SetVectorType(VectorType::FLAT_VECTOR);
}